

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Pgno ptrmapPageno(BtShared *pBt,Pgno pgno)

{
  uint uVar1;
  int iVar2;
  Pgno local_28;
  Pgno ret;
  Pgno iPtrMap;
  int nPagesPerMapPage;
  Pgno pgno_local;
  BtShared *pBt_local;
  
  if (pgno < 2) {
    pBt_local._4_4_ = 0;
  }
  else {
    uVar1 = pBt->usableSize / 5 + 1;
    iVar2 = ((pgno - 2) / uVar1) * uVar1;
    local_28 = iVar2 + 2;
    if (local_28 == (uint)sqlite3PendingByte / pBt->pageSize + 1) {
      local_28 = iVar2 + 3;
    }
    pBt_local._4_4_ = local_28;
  }
  return pBt_local._4_4_;
}

Assistant:

static Pgno ptrmapPageno(BtShared *pBt, Pgno pgno){
  int nPagesPerMapPage;
  Pgno iPtrMap, ret;
  assert( sqlite3_mutex_held(pBt->mutex) );
  if( pgno<2 ) return 0;
  nPagesPerMapPage = (pBt->usableSize/5)+1;
  iPtrMap = (pgno-2)/nPagesPerMapPage;
  ret = (iPtrMap*nPagesPerMapPage) + 2; 
  if( ret==PENDING_BYTE_PAGE(pBt) ){
    ret++;
  }
  return ret;
}